

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::node::get_item
          (node *this,sha1_hash *target,function<void_(const_libtorrent::dht::item_&)> *f)

{
  dht_observer *pdVar1;
  int iVar2;
  difference_type in_RCX;
  span<const_char> in;
  shared_ptr<libtorrent::dht::get_item> ta;
  _Any_data local_70 [2];
  _Any_data local_48;
  _Base_ptr local_38;
  _Base_ptr p_Stack_30;
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      pdVar1 = this->m_observer;
      in.m_len = in_RCX;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)local_70,(aux *)target,in);
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"starting get for [ hash: %s ]",local_70[0]._M_unused._M_object);
      ::std::__cxx11::string::~string((string *)local_70[0]._M_pod_data);
    }
  }
  ::std::function<void_(const_libtorrent::dht::item_&)>::function
            ((function<void_(const_libtorrent::dht::item_&)> *)local_70,f);
  local_38 = (_Base_ptr)0x0;
  p_Stack_30 = (_Base_ptr)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = (_Base_ptr)0x0;
  ::std::
  make_shared<libtorrent::dht::get_item,libtorrent::dht::node&,libtorrent::digest32<160l>const&,std::_Bind<std::function<void(libtorrent::dht::item_const&)>(std::_Placeholder<1>)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            ((node *)&ta,(digest32<160L> *)this,
             (_Bind<std::function<void_(const_libtorrent::dht::item_&)>_(std::_Placeholder<1>)> *)
             target,(function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                     *)local_70);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)local_70);
  (*((ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void node::get_item(sha1_hash const& target, std::function<void(item const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "starting get for [ hash: %s ]"
			, aux::to_hex(target).c_str());
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, target
		, std::bind(f, _1), find_data::nodes_callback());
	ta->start();
}